

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

void message_written(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err)

{
  cio_websocket_write_job *job;
  cio_error err_00;
  cio_websocket_write_job *pcVar1;
  
  pcVar1 = write_jobs_popfront((cio_websocket *)handler_context);
  job = *(cio_websocket_write_job **)((long)handler_context + 0x218);
  (*pcVar1->handler)((cio_websocket *)handler_context,pcVar1->handler_context,err);
  if (job != (cio_websocket_write_job *)0x0) {
    err_00 = send_frame((cio_websocket *)handler_context,job,(job->wbh->data).element.length);
    if (err_00 != CIO_SUCCESS) {
      handle_error((cio_websocket *)handler_context,err_00,CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,
                   "could not send next frame");
      return;
    }
  }
  return;
}

Assistant:

static void message_written(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err)
{
	(void)buffered_stream;
	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	const struct cio_websocket_write_job *job = write_jobs_popfront(websocket);
	struct cio_websocket_write_job *first_job = websocket->ws_private.first_write_job;

	job->handler(websocket, job->handler_context, err);

	if (first_job != NULL) {
		size_t length = cio_write_buffer_get_total_size(first_job->wbh);
		err = send_frame(websocket, first_job, length);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "could not send next frame");
		}
	}
}